

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O1

string * build_repetition(string *__return_storage_ptr__,string *item_rule,int min_items,
                         int max_items,string *separator_rule)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong *puVar8;
  size_type *psVar9;
  int min_items_00;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  uint uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (max_items == 1 && min_items == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (item_rule->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + item_rule->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (separator_rule->_M_string_length == 0) {
    if (min_items == 1 && (max_items ^ 0x7fffffffU) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (item_rule->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + item_rule->_M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if ((max_items ^ 0x7fffffffU) == 0 && min_items == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (item_rule->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + item_rule->_M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_d0 = &local_c0;
    pcVar2 = (item_rule->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + item_rule->_M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    uVar11 = -min_items;
    if (0 < min_items) {
      uVar11 = min_items;
    }
    uVar14 = 1;
    if (9 < uVar11) {
      uVar10 = (ulong)uVar11;
      uVar4 = 4;
      do {
        uVar14 = uVar4;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001fdf61;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001fdf61;
        }
        if (uVar7 < 10000) goto LAB_001fdf61;
        uVar10 = uVar10 / 10000;
        uVar4 = uVar14 + 4;
      } while (99999 < uVar7);
      uVar14 = uVar14 + 1;
    }
LAB_001fdf61:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar14 - (char)(min_items >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)min_items >> 0x1f) + (long)local_b0),uVar14,uVar11);
    uVar12 = 0xf;
    if (local_d0 != &local_c0) {
      uVar12 = local_c0._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (ulong)(local_a8 + local_c8)) {
      uVar10 = 0xf;
      if (local_b0 != &local_a0) {
        uVar10 = local_a0;
      }
      if (uVar10 < (ulong)(local_a8 + local_c8)) goto LAB_001fdfd5;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_001fdfd5:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar9 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90.field_2._8_8_ = puVar6[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_90._M_string_length = puVar6[1];
    *puVar6 = psVar9;
    puVar6[1] = 0;
    *(undefined1 *)psVar9 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    paVar1 = &local_f0.field_2;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_f0.field_2._M_allocated_capacity = *puVar8;
      local_f0.field_2._8_4_ = (undefined4)plVar5[3];
      local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar8;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (max_items == 0x7fffffff) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    }
    else {
      uVar11 = -max_items;
      if (0 < max_items) {
        uVar11 = max_items;
      }
      uVar14 = 1;
      if (9 < uVar11) {
        uVar10 = (ulong)uVar11;
        uVar4 = 4;
        do {
          uVar14 = uVar4;
          uVar7 = (uint)uVar10;
          if (uVar7 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_001fe12e;
          }
          if (uVar7 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_001fe12e;
          }
          if (uVar7 < 10000) goto LAB_001fe12e;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar14 + 4;
        } while (99999 < uVar7);
        uVar14 = uVar14 + 1;
      }
LAB_001fe12e:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar14 - (char)(max_items >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_70._M_dataplus._M_p + ((uint)max_items >> 0x1f),uVar14,uVar11);
    }
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_70._M_string_length + local_f0._M_string_length) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar12 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_70._M_string_length + local_f0._M_string_length) goto LAB_001fe1b3;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
    }
    else {
LAB_001fe1b3:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70._M_dataplus._M_p);
    }
    local_110 = &local_100;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_100 = *puVar8;
      uStack_f8 = puVar6[3];
    }
    else {
      local_100 = *puVar8;
      local_110 = (ulong *)*puVar6;
    }
    local_108 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    uVar12 = local_c0._M_allocated_capacity;
    _Var13._M_p = (pointer)local_d0;
    if (local_d0 == &local_c0) {
      return __return_storage_ptr__;
    }
    goto LAB_001fe30e;
  }
  local_110 = &local_100;
  pcVar2 = (item_rule->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + item_rule->_M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  std::operator+(&local_70,"(",separator_rule);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0 = &local_a0;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_a0 = *puVar8;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *puVar8;
    local_b0 = (ulong *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(item_rule->_M_dataplus)._M_p);
  local_d0 = &local_c0;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_c0._M_allocated_capacity = *puVar8;
    local_c0._8_8_ = plVar5[3];
  }
  else {
    local_c0._M_allocated_capacity = *puVar8;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_90.field_2._M_allocated_capacity = *psVar9;
    local_90.field_2._8_8_ = puVar6[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar9;
    local_90._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_90._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  min_items_00 = min_items + -1;
  if (min_items == 0) {
    min_items_00 = 0;
  }
  build_repetition(&local_f0,&local_90,min_items_00,max_items - (uint)(max_items != 0x7fffffff),
                   &local_50);
  uVar10 = 0xf;
  if (local_110 != &local_100) {
    uVar10 = local_100;
  }
  if (uVar10 < local_f0._M_string_length + local_108) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f0._M_string_length + local_108) goto LAB_001fdd22;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001fdd22:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar9) {
    uVar12 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (min_items != 0) {
    return __return_storage_ptr__;
  }
  std::operator+(&local_f0,"(",__return_storage_ptr__);
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  puVar8 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar8) {
    local_100 = *puVar8;
    uStack_f8 = puVar6[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar8;
    local_110 = (ulong *)*puVar6;
  }
  local_108 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  uVar12 = local_f0.field_2._M_allocated_capacity;
  _Var13._M_p = local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_001fe30e:
  operator_delete(_Var13._M_p,uVar12 + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string build_repetition(const std::string & item_rule, int min_items, int max_items, const std::string & separator_rule = "") {
    auto has_max = max_items != std::numeric_limits<int>::max();

    if (min_items == 0 && max_items == 1) {
        return item_rule + "?";
    }

    if (separator_rule.empty()) {
        if (min_items == 1 && !has_max) {
            return item_rule + "+";
        } else if (min_items == 0 && !has_max) {
            return item_rule + "*";
        } else {
            return item_rule + "{" + std::to_string(min_items) + "," + (has_max ? std::to_string(max_items) : "") + "}";
        }
    }

    auto result = item_rule + " " + build_repetition("(" + separator_rule + " " + item_rule + ")", min_items == 0 ? 0 : min_items - 1, has_max ? max_items - 1 : max_items);
    if (min_items == 0) {
        result = "(" + result + ")?";
    }
    return result;
}